

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleBuilder.cpp
# Opt level: O1

void __thiscall
Refal2::CModuleBuilder::SetEntry(CModuleBuilder *this,CToken *nameToken,CToken *externalNameToken)

{
  bool bVar1;
  TLabel function;
  CPreparatoryFunction *this_00;
  long *plVar2;
  size_type *psVar3;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = checkModuleExist(this,nameToken);
  if (bVar1) {
    function = declare(this,nameToken);
    this_00 = getFunction(this,function);
    if (this_00->type != PFT_External) {
      CPreparatoryFunction::SetEntry(this_00,externalNameToken);
      return;
    }
    std::operator+(&local_38,"function `",&nameToken->word);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_38);
    psVar3 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar3) {
      local_58.field_2._M_allocated_capacity = *psVar3;
      local_58.field_2._8_8_ = plVar2[3];
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    }
    else {
      local_58.field_2._M_allocated_capacity = *psVar3;
      local_58._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_58._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    CErrorsHelper::RaiseError((CErrorsHelper *)this,ES_Error,&local_58,nameToken);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void CModuleBuilder::SetEntry( const CToken& nameToken,
	const CToken& externalNameToken )
{
	if( !checkModuleExist( nameToken ) ) {
		return;
	}
	CPreparatoryFunction& function = addFunction( nameToken );
	if( function.IsExternal() ) {
		error( nameToken, "function `" + nameToken.word +
			"` already defined as external" );
	} else {
		function.SetEntry( externalNameToken );
	}
}